

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyId __thiscall
Js::ScriptContext::GetOrAddPropertyIdTracked
          (ScriptContext *this,LPCWSTR propertyName,int propertyNameLength)

{
  PropertyId PVar1;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  LPCWSTR pWStack_18;
  int propertyNameLength_local;
  LPCWSTR propertyName_local;
  ScriptContext *this_local;
  
  local_28 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = propertyNameLength;
  pWStack_18 = propertyName;
  propertyName_local = (LPCWSTR)this;
  ThreadContext::GetOrAddPropertyId(this->threadContext,propertyName,propertyNameLength,&local_28);
  if (propertyRecord._4_4_ == 2) {
    CachePropertyString2(this,local_28);
  }
  TrackPid(this,local_28);
  PVar1 = PropertyRecord::GetPropertyId(local_28);
  return PVar1;
}

Assistant:

PropertyId ScriptContext::GetOrAddPropertyIdTracked(__in_ecount(propertyNameLength) LPCWSTR propertyName, __in int propertyNameLength)
    {
        Js::PropertyRecord const * propertyRecord = nullptr;
        threadContext->GetOrAddPropertyId(propertyName, propertyNameLength, &propertyRecord);
        if (propertyNameLength == 2)
        {
            CachePropertyString2(propertyRecord);
        }
        this->TrackPid(propertyRecord);

        return propertyRecord->GetPropertyId();
    }